

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O2

int LS_Thing_ProjectileGravity
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  bool bVar1;
  DAngle local_8;
  
  local_8.Degrees = (double)arg2 * 1.40625;
  bVar1 = P_Thing_Projectile(arg0,it,arg1,(char *)0x0,&local_8,(double)arg3 * 0.125,
                             (double)arg4 * 0.125,0,(AActor *)0x0,1,0,false);
  return (int)bVar1;
}

Assistant:

FUNC(LS_Thing_ProjectileGravity)
// Thing_ProjectileGravity (tid, type, angle, speed, vspeed)
{
	return P_Thing_Projectile (arg0, it, arg1, NULL, BYTEANGLE(arg2), SPEED(arg3),
		SPEED(arg4), 0, NULL, 1, 0, false);
}